

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

int m_flush_block(aec_stream *strm)

{
  internal_state *piVar1;
  long lVar2;
  code *vec;
  vector_t *extraout_RAX;
  size_t sVar3;
  
  piVar1 = strm->state;
  if (piVar1->direct_out == 0) {
    piVar1->i = 0;
    vec = m_flush_block_resumable;
    piVar1->mode = m_flush_block_resumable;
  }
  else {
    lVar2 = (long)(*(int *)&piVar1->cds - (int)strm->next_out);
    strm->next_out = strm->next_out + lVar2;
    sVar3 = strm->avail_out - lVar2;
    strm->avail_out = sVar3;
    vec = m_get_block;
    piVar1->mode = m_get_block;
    if (((piVar1->ready_to_capture_rsi != 0) && (piVar1->blocks_avail == 0)) &&
       (vec = (code *)piVar1->offsets, (vector_t *)vec != (vector_t *)0x0)) {
      vector_push_back((vector_t *)vec,((strm->total_out - sVar3) * 8 - (long)piVar1->bits) + 8);
      piVar1->ready_to_capture_rsi = 0;
      vec = (code *)extraout_RAX;
    }
  }
  return (int)vec;
}

Assistant:

static int m_flush_block(struct aec_stream *strm)
{
    /**
       Flush block in direct_out mode by updating counters.

       Fall back to slow flushing if in buffered mode.
    */
    struct internal_state *state = strm->state;

#ifdef ENABLE_RSI_PADDING
    if (state->blocks_avail == 0 &&
        strm->flags & AEC_PAD_RSI &&
        state->block_nonzero == 0)
            emit(state, 0, state->bits % 8);
#endif

    if (state->direct_out) {
        int n = (int)(state->cds - strm->next_out);
        strm->next_out += n;
        strm->avail_out -= n;
        state->mode = m_get_block;

        if (state->ready_to_capture_rsi &&
            state->blocks_avail == 0 &&
            state->offsets != NULL) {
                vector_push_back(state->offsets, (strm->total_out - strm->avail_out) * 8 + (8 - state->bits));
                state->ready_to_capture_rsi = 0;
        }

        return M_CONTINUE;
    }

    state->i = 0;
    state->mode = m_flush_block_resumable;
    return M_CONTINUE;
}